

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint *puVar1;
  char *pcVar2;
  short sVar3;
  char cVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  iterator iVar9;
  ostream *poVar10;
  size_t sVar11;
  istream *piVar12;
  long *plVar13;
  undefined8 uVar14;
  long lVar15;
  ushort uVar16;
  ulong uVar17;
  uint16_t start;
  uint16_t pc;
  uint16_t data;
  SystemMemory m;
  string action;
  CPU cpu;
  ifstream file;
  stringstream a;
  byte local_459;
  uint local_458;
  short local_454;
  uint16_t local_452;
  uint local_450;
  allocator<char> local_449;
  ulong local_448;
  int local_43c;
  allocator<char> local_438;
  undefined7 uStack_437;
  long local_428 [2];
  SystemMemory local_418;
  undefined1 *local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e8;
  undefined7 uStack_3e7;
  CPU local_3d8;
  key_type local_3c0 [16];
  long local_1b8 [2];
  long local_1a8;
  uint local_1a0 [26];
  ios_base local_138 [264];
  
  SystemMemory::SystemMemory(&local_418,0x10000);
  local_3f8 = &local_3e8;
  local_3f0 = 0;
  local_3e8 = 0;
  local_3d8.memory = &local_418.super_MemoryBus;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_452 = 0;
  local_454 = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3c0,argv[1],&local_438);
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&help_abi_cxx11_._M_h,local_3c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,(ushort)local_3c0[0]._M_dataplus._M_p) !=
      &local_3c0[0].field_2) {
    operator_delete((undefined1 *)
                    CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,
                             (ushort)local_3c0[0]._M_dataplus._M_p),
                    local_3c0[0].field_2._M_allocated_capacity + 1);
  }
  if (iVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_43c = argc;
    if (argc < 1) {
      local_458 = 0;
      local_450 = 0;
    }
    else {
      uVar17 = 0;
      local_450 = 0;
      local_458 = 0;
      local_448 = (ulong)(uint)argc;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3c0,argv[uVar17],&local_438);
        iVar7 = std::__cxx11::string::compare((char *)local_3c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,(ushort)local_3c0[0]._M_dataplus._M_p)
            != &local_3c0[0].field_2) {
          operator_delete((undefined1 *)
                          CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,
                                   (ushort)local_3c0[0]._M_dataplus._M_p),
                          local_3c0[0].field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_3c0,argv[uVar17],&local_438);
        iVar8 = std::__cxx11::string::compare((char *)local_3c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,(ushort)local_3c0[0]._M_dataplus._M_p)
            != &local_3c0[0].field_2) {
          operator_delete((undefined1 *)
                          CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,
                                   (ushort)local_3c0[0]._M_dataplus._M_p),
                          local_3c0[0].field_2._M_allocated_capacity + 1);
        }
        local_458 = CONCAT31((int3)(local_458 >> 8),(byte)local_458 | iVar7 == 0);
        local_450 = CONCAT31((int3)(local_450 >> 8),(byte)local_450 | iVar8 == 0);
        uVar17 = uVar17 + 1;
      } while (local_448 != uVar17);
    }
    lVar15 = (long)local_43c;
    pcVar2 = argv[lVar15 + -2];
    iVar7 = (int)(ostream *)&local_1a8;
    if (pcVar2 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar2,sVar11);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
    pcVar2 = argv[lVar15 + -1];
    if (pcVar2 == (char *)0x0) {
      std::ios::clear(iVar7 + (int)*(undefined8 *)(local_1a8 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar2,sVar11);
    }
    *(uint *)((long)local_1a0 + *(long *)(local_1b8[0] + -0x18)) =
         *(uint *)((long)local_1a0 + *(long *)(local_1b8[0] + -0x18)) & 0xffffffb5 | 8;
    piVar12 = std::istream::_M_extract<unsigned_short>((ushort *)local_1b8);
    std::istream::_M_extract<unsigned_short>((ushort *)piVar12);
    std::__cxx11::stringbuf::str();
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         (char *)CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,
                                          (ushort)local_3c0[0]._M_dataplus._M_p),
                         local_3c0[0]._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,(ushort)local_3c0[0]._M_dataplus._M_p) !=
        &local_3c0[0].field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,
                               (ushort)local_3c0[0]._M_dataplus._M_p),
                      local_3c0[0].field_2._M_allocated_capacity + 1);
    }
    CPU::Reset(&local_3d8,local_452);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_438,argv[lVar15 + -3],&local_449);
    sVar3 = local_454;
    std::ifstream::ifstream(local_3c0,(string *)&local_438,_S_bin);
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 != '\0') {
      local_448 = CONCAT71(local_448._1_7_,cVar4);
      puVar1 = (uint *)((long)&local_3c0[0].field_2 +
                       *(long *)(CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,
                                          (ushort)local_3c0[0]._M_dataplus._M_p) + -0x18) + 8);
      *puVar1 = *puVar1 & 0xffffefff;
      uVar16 = sVar3 - 1;
      if (sVar3 == 0) {
        uVar16 = 0;
      }
      while( true ) {
        uVar16 = uVar16 + 1;
        piVar12 = std::operator>>((istream *)local_3c0,(char *)&local_459);
        if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
        (*local_418.super_MemoryBus._vptr_MemoryBus[3])(&local_418,(ulong)uVar16,(ulong)local_459);
      }
      cVar4 = (char)local_448;
    }
    std::ifstream::~ifstream(local_3c0);
    if ((long *)CONCAT71(uStack_437,local_438) != local_428) {
      operator_delete((long *)CONCAT71(uStack_437,local_438),local_428[0] + 1);
    }
    if (cVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error: can\'t read file",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
    }
    else {
LAB_00102a36:
      do {
        if ((local_450 & 1) != 0) {
          system("clear");
          CPU::GetStatus(&local_3d8);
        }
        bVar5 = CPU::Execute(&local_3d8);
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"BRK Handled",0xb);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
          if ((local_458 & 1) == 0) break;
        }
        else if ((local_458 & 1) == 0) goto LAB_00102a36;
        std::operator>>((istream *)&std::cin,(string *)&local_3f8);
        std::istream::get();
        iVar7 = std::__cxx11::string::compare((char *)&local_3f8);
        if (iVar7 == 0) {
          iVar7 = -0x100;
          do {
            *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                     *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                          *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
            bVar6 = SystemMemory::Read(&local_418,(short)iVar7 + 0x200);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)bVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            iVar7 = iVar7 + 1;
          } while (iVar7 != 0);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
          std::istream::get();
          goto LAB_00102a36;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_3f8);
        if (iVar7 == 0) {
          *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) =
               *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) & 0xffffffb5 | 8;
          std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
          std::istream::get();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Memory content at 0x",0x14);
          *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                   *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__detail::_Prime_rehash_policy::_M_need_rehash +
                        *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)&std::cout,(uint)(ushort)local_3c0[0]._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
          bVar6 = SystemMemory::Read(&local_418,(ushort)local_3c0[0]._M_dataplus._M_p);
          plVar13 = (long *)std::ostream::operator<<(poVar10,(uint)bVar6);
          std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
          std::ostream::put((char)plVar13);
          std::ostream::flush();
          std::istream::get();
          goto LAB_00102a36;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_3f8);
        if (iVar7 == 0) {
          *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) =
               *(uint *)(std::ios_base::Init::~Init + *(long *)(std::cin + -0x18)) & 0xffffffb5 | 8;
          piVar12 = std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
          std::istream::_M_extract<unsigned_short>((ushort *)piVar12);
          std::istream::get();
          SystemMemory::Write(&local_418,(ushort)local_3c0[0]._M_dataplus._M_p,(uint8_t)local_438);
          goto LAB_00102a36;
        }
        iVar7 = std::__cxx11::string::compare((char *)&local_3f8);
      } while (iVar7 != 0);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3c0,argv[1],&local_438);
    iVar9 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&help_abi_cxx11_._M_h,local_3c0);
    if (iVar9.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      uVar14 = std::__throw_out_of_range("_Map_base::at");
      if ((long *)CONCAT71(uStack_437,local_438) != local_428) {
        operator_delete((long *)CONCAT71(uStack_437,local_438),local_428[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      if (local_3f8 != &local_3e8) {
        operator_delete(local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
      }
      local_418.super_MemoryBus._vptr_MemoryBus = (_func_int **)&PTR__SystemMemory_0010bd60;
      if (local_418.ram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_418.ram.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_418.ram.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_418.ram.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar14);
    }
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         *(char **)((long)iVar9.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                          ._M_cur + 0x28),
                         *(long *)((long)iVar9.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                         ._M_cur + 0x30));
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,(ushort)local_3c0[0]._M_dataplus._M_p) !=
        &local_3c0[0].field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_3c0[0]._M_dataplus._M_p._2_6_,
                               (ushort)local_3c0[0]._M_dataplus._M_p),
                      local_3c0[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_3f8 != &local_3e8) {
    operator_delete(local_3f8,CONCAT71(uStack_3e7,local_3e8) + 1);
  }
  local_418.super_MemoryBus._vptr_MemoryBus = (_func_int **)&PTR__SystemMemory_0010bd60;
  if (local_418.ram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_418.ram.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_418.ram.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_418.ram.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    SystemMemory m(1024 * 64);
    CPU cpu(m);
    
    std::string action;
    std::stringstream a;

    uint16_t pc{}, start{};
    bool memoryControl{}, status{};
    
    if(help.find(argv[1]) != help.end())
    {
        std::cout << help.at(argv[1]) << std::endl;
        
        return 0;
    }

    for(int i = 0; i < argc; i++)
    {
        memoryControl = (std::string(argv[i]) == "--memory-control" ? true : memoryControl);
        status = (std::string(argv[i]) == "--show-status" ? true : status);
    }

    a << argv[argc - 2] << " " << argv[argc - 1];
    a >> std::hex >> start >> pc;

    std::cout << a.str() << std::endl;

    cpu.Reset(pc);
    
    if(!ReadFile(argv[argc - 3], m, start))
    {
        std::cout << "Error: can't read file" << std::endl;
        
        return 0;
    }

    while(true)
    {
        if(status)
        {
            system("clear");
            cpu.GetStatus();
        }
        
        if(cpu.Execute())
        {
            std::cout << "BRK Handled" << std::endl;
            
            if(!memoryControl)
                break;
        }

        if(memoryControl)
        {
            (std::cin >> action).get();

            if(action == "stack")
            {
                for(int i = 0; i < 256; i++)
                    std::cout << std::hex << (int)m.Read(0x0100 + i) << " ";
                
                std::cout << std::endl;

                std::cin.get();
            }
            else if(action == "read")
            {
                uint16_t addr;
                
                (std::cin >> std::hex >> addr).get();
                std::cout << "Memory content at 0x" << std::hex << (int)addr << " = " << (int)m.Read(addr) << std::endl;
                
                std::cin.get();
            }
            else if(action == "write")
            {
                uint16_t addr, data;

                (std::cin >> std::hex >> addr >> data).get();
                
                m.Write(addr, static_cast<uint8_t>(data));
            }
            else if(action == "stop")
                return 0;
        }
    } 
}